

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char16_t_*> __thiscall
fmt::v8::detail::format_decimal<char16_t,unsigned__int128>
          (detail *this,char16_t *out,unsigned___int128 value,int size)

{
  int iVar1;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar2;
  undefined8 unaff_RBX;
  detail *pdVar3;
  undefined1 auVar4 [16];
  format_decimal_result<char16_t_*> fVar5;
  
  uVar2 = CONCAT44(in_register_00000014,size);
  auVar4._8_8_ = unaff_RBX;
  auVar4._0_8_ = in_RAX;
  iVar1 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar4);
  if (iVar1 <= in_ECX) {
    pdVar3 = this + (long)in_ECX * 2 + -2;
    while ((out < (char16_t *)0x64) <= uVar2) {
      auVar4 = __udivti3(out,uVar2,100,0);
      *(short *)(pdVar3 + -2) =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)(out + (long)auVar4._0_8_ * -0x32) * 2];
      *(short *)pdVar3 =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)(out + (long)auVar4._0_8_ * -0x32) * 2 + 1];
      pdVar3 = pdVar3 + -4;
      out = auVar4._0_8_;
      uVar2 = auVar4._8_8_;
    }
    if (uVar2 == 0 && (ulong)((char16_t *)0x9 < out) <= -uVar2) {
      *(ushort *)pdVar3 = (ushort)out | 0x30;
    }
    else {
      *(short *)(pdVar3 + -2) =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)out * 2];
      *(short *)pdVar3 =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)out * 2 + 1];
      pdVar3 = pdVar3 + -2;
    }
    fVar5.end = (char16_t *)(this + (long)in_ECX * 2);
    fVar5.begin = (char16_t *)pdVar3;
    return fVar5;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}